

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

Status __thiscall spvtools::opt::CopyPropagateArrays::Process(CopyPropagateArrays *this)

{
  bool bVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  StorageClass SVar5;
  Status SVar6;
  Module *this_00;
  reference this_01;
  Instruction *pIVar7;
  reference ppIVar8;
  pointer pMVar9;
  undefined1 local_88 [8];
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  source_object;
  Instruction *store_inst;
  Instruction *var_inst_1;
  undefined1 local_68 [8];
  iterator var_inst;
  BasicBlock *entry_bb;
  Function *function;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  bool modified;
  CopyPropagateArrays *this_local;
  
  bVar1 = false;
  this_00 = Pass::get_module((Pass *)this);
  join_0x00000010_0x00000000_ = (_Prime_rehash_policy)Module::begin(this_00);
  _function = Module::end(this_00);
  while (bVar2 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&function), bVar2)
  {
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    bVar2 = opt::Function::IsDeclaration(this_01);
    if (!bVar2) {
      _var_inst = opt::Function::begin(this_01);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&var_inst);
      BasicBlock::begin((BasicBlock *)local_68);
      while( true ) {
        pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)local_68);
        OVar3 = opt::Instruction::opcode(pIVar7);
        if (OVar3 != OpVariable) break;
        var_inst_1 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator*
                               ((iterator_template<spvtools::opt::Instruction> *)local_68);
        std::
        queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::push(&this->worklist_,&var_inst_1);
        InstructionList::iterator::operator++((iterator *)local_68);
      }
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  do {
    do {
      bVar2 = std::
              queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::empty(&this->worklist_);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        SVar6 = SuccessWithoutChange;
        if (bVar1) {
          SVar6 = SuccessWithChange;
        }
        return SVar6;
      }
      ppIVar8 = std::
                queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::front(&this->worklist_);
      pIVar7 = *ppIVar8;
      std::
      queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::pop(&this->worklist_);
      source_object._M_t.
      super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
      .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>._M_head_impl
           = (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
              )FindStoreInstruction(this,pIVar7);
    } while ((tuple<spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
              )source_object._M_t.
               super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
               .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
               _M_head_impl ==
             (_Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>)0x0);
    FindSourceObjectIfPossible((CopyPropagateArrays *)local_88,(Instruction *)this,pIVar7);
    bVar2 = std::operator!=((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             *)local_88,(nullptr_t)0x0);
    if (bVar2) {
      uVar4 = opt::Instruction::type_id(pIVar7);
      bVar2 = IsPointerToArrayType(this,uVar4);
      if (!bVar2) {
        pMVar9 = std::
                 unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                               *)local_88);
        SVar5 = MemoryObject::GetStorageClass(pMVar9);
        if (SVar5 != Input) goto LAB_0096cddb;
      }
      pMVar9 = std::
               unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
               ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             *)local_88);
      uVar4 = MemoryObject::GetPointerTypeId(pMVar9,this);
      bVar2 = CanUpdateUses(this,pIVar7,uVar4);
      if (bVar2) {
        bVar1 = true;
        pMVar9 = std::
                 unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 ::get((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                        *)local_88);
        PropagateObject(this,pIVar7,pMVar9,
                        (Instruction *)
                        source_object._M_t.
                        super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                        .
                        super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                        ._M_head_impl);
      }
    }
LAB_0096cddb:
    std::
    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
    ::~unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                   *)local_88);
  } while( true );
}

Assistant:

Pass::Status CopyPropagateArrays::Process() {
  bool modified = false;
  for (Function& function : *get_module()) {
    if (function.IsDeclaration()) {
      continue;
    }

    BasicBlock* entry_bb = &*function.begin();

    for (auto var_inst = entry_bb->begin();
         var_inst->opcode() == spv::Op::OpVariable; ++var_inst) {
      worklist_.push(&*var_inst);
    }
  }

  while (!worklist_.empty()) {
    Instruction* var_inst = worklist_.front();
    worklist_.pop();

    // Find the only store to the entire memory location, if it exists.
    Instruction* store_inst = FindStoreInstruction(&*var_inst);

    if (!store_inst) {
      continue;
    }

    std::unique_ptr<MemoryObject> source_object =
        FindSourceObjectIfPossible(&*var_inst, store_inst);

    if (source_object != nullptr) {
      if (!IsPointerToArrayType(var_inst->type_id()) &&
          source_object->GetStorageClass() != spv::StorageClass::Input) {
        continue;
      }

      if (CanUpdateUses(&*var_inst, source_object->GetPointerTypeId(this))) {
        modified = true;

        PropagateObject(&*var_inst, source_object.get(), store_inst);
      }
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}